

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixStep2
               (double *f0_step1,int f0_length,int voice_range_minimum,double *f0_step2)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int j;
  int i_1;
  int number_of_boundaries;
  int *boundary_list;
  int i;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
    *(undefined8 *)(in_RCX + (long)iVar4 * 8) = *(undefined8 *)(in_RDI + (long)iVar4 * 8);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  iVar4 = GetBoundaryList((double *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                          (int *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  for (local_30 = 0; local_30 < iVar4 / 2; local_30 = local_30 + 1) {
    if (*(int *)((long)pvVar3 + (long)(local_30 * 2 + 1) * 4) -
        *(int *)((long)pvVar3 + (long)(local_30 << 1) * 4) < in_EDX) {
      for (local_34 = *(int *)((long)pvVar3 + (long)(local_30 << 1) * 4);
          local_34 <= *(int *)((long)pvVar3 + (long)(local_30 * 2 + 1) * 4); local_34 = local_34 + 1
          ) {
        *(undefined8 *)(in_RCX + (long)local_34 * 8) = 0;
      }
    }
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

static void FixStep2(const double *f0_step1, int f0_length,
    int voice_range_minimum, double *f0_step2) {
  for (int i = 0; i < f0_length; ++i) f0_step2[i] = f0_step1[i];

  int center = (voice_range_minimum - 1) / 2;
  for (int i = center; i < f0_length - center; ++i) {
    for (int j = -center; j <= center; ++j) {
      if (f0_step1[i + j] == 0) {
        f0_step2[i] = 0.0;
        break;
      }
    }
  }
}